

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::tryFloat(TokenStream *this,Token *token,ParseLocation *loc)

{
  Stream<int> *pSVar1;
  bool bVar2;
  int *piVar3;
  char cVar4;
  float f;
  double dVar5;
  string str;
  string local_a8;
  ParseLocation local_88;
  Token local_68;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_68,"nan",(allocator *)&local_88);
  bVar2 = trySymbol(this,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    f = NAN;
LAB_001cb5e3:
    local_88.colNumber._4_4_ = 0xffffffff;
    local_88.colNumber._0_4_ = 0xffffffff;
    local_88.lineNumber._4_4_ = 0xffffffff;
    local_88.lineNumber._0_4_ = 0xffffffff;
    local_88.fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_88.fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Token::Token(&local_68,f,&local_88);
    Token::operator=(token,&local_68);
    Token::~Token(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"+inf",(allocator *)&local_88);
    bVar2 = trySymbol(this,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar2) {
      f = INFINITY;
      goto LAB_001cb5e3;
    }
    std::__cxx11::string::string((string *)&local_68,"-inf",(allocator *)&local_88);
    bVar2 = trySymbol(this,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar2) {
      f = -INFINITY;
      goto LAB_001cb5e3;
    }
    bVar2 = decDigits(this,&local_a8);
    pSVar1 = (this->cin).ptr;
    cVar4 = (char)&local_a8;
    if (!bVar2) {
      piVar3 = Stream<int>::peek(pSVar1);
      if (*piVar3 == 0x2e) {
        Stream<int>::get((this->cin).ptr);
        std::__cxx11::string::push_back(cVar4);
        bVar2 = decDigits(this,&local_a8);
        if (bVar2) {
          piVar3 = Stream<int>::peek((this->cin).ptr);
          if (*piVar3 != 0x65) {
            piVar3 = Stream<int>::peek((this->cin).ptr);
            goto LAB_001cb6c7;
          }
          goto LAB_001cb6e6;
        }
      }
LAB_001cb73e:
      Stream<int>::unget((this->cin).ptr,local_a8._M_string_length);
      bVar2 = false;
      goto LAB_001cb60a;
    }
    piVar3 = Stream<int>::peek(pSVar1);
    pSVar1 = (this->cin).ptr;
    if (*piVar3 != 0x2e) {
      piVar3 = Stream<int>::peek(pSVar1);
      if ((*piVar3 == 0x65) || (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 == 0x45))
      goto LAB_001cb6e6;
      goto LAB_001cb73e;
    }
    Stream<int>::get(pSVar1);
    std::__cxx11::string::push_back(cVar4);
    decDigits(this,&local_a8);
    piVar3 = Stream<int>::peek((this->cin).ptr);
    if (*piVar3 == 0x65) {
LAB_001cb6e6:
      Stream<int>::get((this->cin).ptr);
      std::__cxx11::string::push_back(cVar4);
      bVar2 = decDigits(this,&local_a8);
      if (!bVar2) goto LAB_001cb73e;
    }
    else {
      piVar3 = Stream<int>::peek((this->cin).ptr);
LAB_001cb6c7:
      if (*piVar3 == 0x45) goto LAB_001cb6e6;
    }
    dVar5 = atof(local_a8._M_dataplus._M_p);
    Token::Token(&local_68,(float)dVar5,loc);
    Token::operator=(token,&local_68);
    Token::~Token(&local_68);
  }
  bVar2 = true;
LAB_001cb60a:
  std::__cxx11::string::~string((string *)&local_a8);
  return bVar2;
}

Assistant:

bool TokenStream::tryFloat(Token& token, const ParseLocation& loc)
  {
    bool ok = false;
    std::string str;
    if (trySymbol("nan")) {
      token = Token(float(nan));
      return true;
    }
    if (trySymbol("+inf")) {
      token = Token(float(pos_inf));
      return true;
    }
    if (trySymbol("-inf")) {
      token = Token(float(neg_inf));
      return true;
    }

    if (decDigits(str))
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        decDigits(str);
        if (cin->peek() == 'e' || cin->peek() == 'E') {
          str += (char)cin->get();
          if (decDigits(str)) ok = true; // 1.[2]E2
        }
        else ok = true; // 1.[2]
      }
      else if (cin->peek() == 'e' || cin->peek() == 'E') {
        str += (char)cin->get();
        if (decDigits(str)) ok = true; // 1E2
      }
    }
    else
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        if (decDigits(str)) {
          if (cin->peek() == 'e' || cin->peek() == 'E') {
            str += (char)cin->get();
            if (decDigits(str)) ok = true; // .3E2
          }
          else ok = true; // .3
        }
      }
    }
    if (ok) {
      token = Token((float)atof(str.c_str()),loc);
    }
    else cin->unget(str.size());
    return ok;
  }